

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O0

rt_vector_expr<viennamath::rt_expression_interface<double>_> *
viennamath::operator*
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *__return_storage_ptr__,
          ct_constant<8L> *lhs,rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  ulong uVar1;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs_00;
  size_type sVar2;
  const_reference rhs_00;
  reference this;
  type local_50;
  ulong local_30;
  size_t i;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *local_20;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs_local;
  ct_constant<8L> *lhs_local;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *result;
  
  i._7_1_ = 0;
  local_20 = rhs;
  rhs_local = (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)lhs;
  lhs_local = (ct_constant<8L> *)__return_storage_ptr__;
  sVar2 = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::size(&rhs->
                  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                );
  rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            (__return_storage_ptr__,sVar2);
  for (local_30 = 0; uVar1 = local_30,
      sVar2 = std::
              vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ::size(&local_20->
                      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                    ), lhs_00 = rhs_local, uVar1 < sVar2; local_30 = local_30 + 1) {
    rhs_00 = std::
             vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             ::operator[](&local_20->
                           super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                          ,local_30);
    operator*(&local_50,(ct_constant<8L> *)lhs_00,rhs_00);
    this = std::
           vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ::operator[](&__return_storage_ptr__->
                         super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ,local_30);
    rt_expr<viennamath::rt_expression_interface<double>_>::operator=(this,&local_50);
    rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

rt_vector_expr<InterfaceType> operator*(T const & lhs, rt_vector_expr<InterfaceType> const & rhs)
  {
    rt_vector_expr<InterfaceType> result(rhs.size());
    for (std::size_t i=0; i<rhs.size(); ++i)
      result[i] = lhs * rhs[i];

    return result;
  }